

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_encode_init(aec_stream *strm)

{
  undefined8 *__s;
  void *pvVar1;
  EVP_PKEY_CTX *in_RDI;
  internal_state *state;
  int local_4;
  
  if ((*(uint *)(in_RDI + 0x30) < 0x21) && (*(int *)(in_RDI + 0x30) != 0)) {
    if ((*(uint *)(in_RDI + 0x3c) & 0x40) == 0) {
      if ((((*(int *)(in_RDI + 0x34) != 8) && (*(int *)(in_RDI + 0x34) != 0x10)) &&
          (*(int *)(in_RDI + 0x34) != 0x20)) && (*(int *)(in_RDI + 0x34) != 0x40)) {
        return -1;
      }
    }
    else if ((*(uint *)(in_RDI + 0x34) & 1) != 0) {
      return -1;
    }
    if (*(uint *)(in_RDI + 0x38) < 0x1001) {
      __s = (undefined8 *)malloc(0x1a0);
      if (__s == (undefined8 *)0x0) {
        local_4 = -4;
      }
      else {
        memset(__s,0,0x1a0);
        *(undefined8 **)(in_RDI + 0x40) = __s;
        *(int *)(__s + 0x33) = *(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 0x30);
        if (*(uint *)(in_RDI + 0x30) < 0x11) {
          if (*(uint *)(in_RDI + 0x30) < 9) {
            if ((*(uint *)(in_RDI + 0x3c) & 0x10) == 0) {
              *(undefined4 *)(__s + 4) = 3;
            }
            else {
              if (4 < *(uint *)(in_RDI + 0x30)) {
                return -1;
              }
              if (*(uint *)(in_RDI + 0x30) < 3) {
                *(undefined4 *)(__s + 4) = 1;
              }
              else {
                *(undefined4 *)(__s + 4) = 2;
              }
            }
            *(undefined4 *)((long)__s + 0x17c) = 1;
            __s[1] = aec_get_8;
            __s[2] = aec_get_rsi_8;
          }
          else {
            *(undefined4 *)(__s + 4) = 4;
            *(undefined4 *)((long)__s + 0x17c) = 2;
            if ((*(uint *)(in_RDI + 0x3c) & 4) == 0) {
              __s[1] = aec_get_lsb_16;
              __s[2] = aec_get_rsi_lsb_16;
            }
            else {
              __s[1] = aec_get_msb_16;
              __s[2] = aec_get_rsi_msb_16;
            }
          }
        }
        else {
          *(undefined4 *)(__s + 4) = 5;
          if ((*(uint *)(in_RDI + 0x30) < 0x19) && ((*(uint *)(in_RDI + 0x3c) & 2) != 0)) {
            *(undefined4 *)((long)__s + 0x17c) = 3;
            if ((*(uint *)(in_RDI + 0x3c) & 4) == 0) {
              __s[1] = aec_get_lsb_24;
              __s[2] = aec_get_rsi_lsb_24;
            }
            else {
              __s[1] = aec_get_msb_24;
              __s[2] = aec_get_rsi_msb_24;
            }
          }
          else {
            *(undefined4 *)((long)__s + 0x17c) = 4;
            if ((*(uint *)(in_RDI + 0x3c) & 4) == 0) {
              __s[1] = aec_get_lsb_32;
              __s[2] = aec_get_rsi_lsb_32;
            }
            else {
              __s[1] = aec_get_msb_32;
              __s[2] = aec_get_rsi_msb_32;
            }
          }
        }
        *(int *)(__s + 10) =
             *(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x34) * *(int *)((long)__s + 0x17c);
        if ((*(uint *)(in_RDI + 0x3c) & 1) == 0) {
          *(undefined4 *)((long)__s + 0x24) = 0;
          *(uint *)(__s + 5) = 0xffffffff >> (0x20U - (char)*(undefined4 *)(in_RDI + 0x30) & 0x1f);
          __s[3] = preprocess_unsigned;
        }
        else {
          *(uint *)(__s + 5) = 0xffffffff >> (0x21U - (char)*(undefined4 *)(in_RDI + 0x30) & 0x1f);
          *(uint *)((long)__s + 0x24) = *(uint *)(__s + 5) ^ 0xffffffff;
          __s[3] = preprocess_signed;
        }
        *(int *)((long)__s + 0x18c) = (1 << ((byte)*(undefined4 *)(__s + 4) & 0x1f)) + -3;
        pvVar1 = malloc((ulong)(uint)(*(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x34)) << 2);
        __s[6] = pvVar1;
        if (__s[6] == 0) {
          cleanup(in_RDI);
          local_4 = -4;
        }
        else {
          if ((*(uint *)(in_RDI + 0x3c) & 8) == 0) {
            __s[7] = __s[6];
          }
          else {
            pvVar1 = malloc((ulong)(uint)(*(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x34)) << 2);
            __s[7] = pvVar1;
            if (__s[7] == 0) {
              cleanup(in_RDI);
              return -4;
            }
          }
          __s[9] = __s[6];
          *(undefined4 *)((long)__s + 0x16c) = 0;
          *(undefined8 *)(in_RDI + 0x10) = 0;
          *(undefined8 *)(in_RDI + 0x28) = 0;
          *(undefined4 *)((long)__s + 0x194) = 0;
          __s[0xb] = __s + 0xc;
          *(undefined1 *)__s[0xb] = 0;
          *(undefined4 *)(__s + 0x2d) = 8;
          *__s = m_get_block;
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int aec_encode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    if (strm->flags & AEC_NOT_ENFORCE) {
        /* All even block sizes are allowed. */
        if (strm->block_size & 1)
            return AEC_CONF_ERROR;
    } else {
        /* Only allow standard conforming block sizes */
        if (strm->block_size != 8
            && strm->block_size != 16
            && strm->block_size != 32
            && strm->block_size != 64)
            return AEC_CONF_ERROR;
    }

    if (strm->rsi > 4096)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;

    memset(state, 0, sizeof(struct internal_state));
    strm->state = state;
    state->uncomp_len = strm->block_size * strm->bits_per_sample;

    if (strm->bits_per_sample > 16) {
        /* 24/32 input bit settings */
        state->id_len = 5;

        if (strm->bits_per_sample <= 24
            && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_24;
                state->get_rsi = aec_get_rsi_msb_24;
            } else {
                state->get_sample = aec_get_lsb_24;
                state->get_rsi = aec_get_rsi_lsb_24;
            }
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_32;
                state->get_rsi = aec_get_rsi_msb_32;
            } else {
                state->get_sample = aec_get_lsb_32;
                state->get_rsi = aec_get_rsi_lsb_32;
            }
        }
    }
    else if (strm->bits_per_sample > 8) {
        /* 16 bit settings */
        state->id_len = 4;
        state->bytes_per_sample = 2;

        if (strm->flags & AEC_DATA_MSB) {
            state->get_sample = aec_get_msb_16;
            state->get_rsi = aec_get_rsi_msb_16;
        } else {
            state->get_sample = aec_get_lsb_16;
            state->get_rsi = aec_get_rsi_lsb_16;
        }
    } else {
        /* 8 bit settings */
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }
        state->bytes_per_sample = 1;

        state->get_sample = aec_get_8;
        state->get_rsi = aec_get_rsi_8;
    }
    state->rsi_len = strm->rsi * strm->block_size * state->bytes_per_sample;

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
        state->preprocess = preprocess_signed;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
        state->preprocess = preprocess_unsigned;
    }

    state->kmax = (1U << state->id_len) - 3;

    state->data_pp = malloc(strm->rsi
                            * strm->block_size
                            * sizeof(uint32_t));
    if (state->data_pp == NULL) {
        cleanup(strm);
        return AEC_MEM_ERROR;
    }

    if (strm->flags & AEC_DATA_PREPROCESS) {
        state->data_raw = malloc(strm->rsi
                                 * strm->block_size
                                 * sizeof(uint32_t));
        if (state->data_raw == NULL) {
            cleanup(strm);
            return AEC_MEM_ERROR;
        }
    } else {
        state->data_raw = state->data_pp;
    }

    state->block = state->data_pp;

    state->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    state->flushed = 0;

    state->cds = state->cds_buf;
    *state->cds = 0;
    state->bits = 8;
    state->mode = m_get_block;

    return AEC_OK;
}